

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O1

void __thiscall
MADPComponentDiscreteStates::SetNrStates(MADPComponentDiscreteStates *this,size_t nrS)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pdVar3;
  iterator __position;
  StateDistributionVector *pSVar4;
  ulong uVar5;
  uint uVar6;
  pointer pSVar7;
  string local_e0;
  string local_c0;
  _func_int **local_a0;
  _func_int **local_98;
  vector<StateDiscrete,_std::allocator<StateDiscrete>_> *local_90;
  StateDiscrete local_88;
  
  this->_m_nrStates = nrS;
  pSVar1 = (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pSVar7 = pSVar1;
  if (pSVar2 != pSVar1) {
    do {
      (**(pSVar7->super_State).super_NamedDescribedEntity._vptr_NamedDescribedEntity)(pSVar7);
      pSVar7 = pSVar7 + 1;
    } while (pSVar7 != pSVar2);
    (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar1;
  }
  if (this->_m_initialStateDistribution == (StateDistributionVector *)0x0) {
    pSVar4 = (StateDistributionVector *)operator_new(0x20);
    (pSVar4->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar4->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar4->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pSVar4->super_StateDistribution)._vptr_StateDistribution =
         (_func_int **)&PTR__StateDistributionVector_0059cb98;
    this->_m_initialStateDistribution = pSVar4;
  }
  pSVar4 = this->_m_initialStateDistribution;
  pdVar3 = (pSVar4->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pSVar4->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar3) {
    (pSVar4->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar3;
  }
  if (nrS != 0) {
    local_90 = &this->_m_stateVec;
    uVar6 = 1;
    local_a0 = (_func_int **)&PTR__StateDiscrete_005d0d38;
    local_98 = (_func_int **)&PTR__StateDiscrete_005d0d68;
    do {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"undefined","");
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"undefined","");
      NamedDescribedEntity::NamedDescribedEntity
                ((NamedDescribedEntity *)&local_88,&local_c0,&local_e0);
      local_88.super_DiscreteEntity._m_index = uVar6 - 1;
      local_88.super_State.super_NamedDescribedEntity._vptr_NamedDescribedEntity = local_a0;
      local_88.super_DiscreteEntity._vptr_DiscreteEntity = local_98;
      std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::emplace_back<StateDiscrete>
                (local_90,&local_88);
      NamedDescribedEntity::~NamedDescribedEntity((NamedDescribedEntity *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      pSVar4 = this->_m_initialStateDistribution;
      local_88.super_State.super_NamedDescribedEntity._vptr_NamedDescribedEntity = (_func_int **)0x0
      ;
      __position._M_current =
           (pSVar4->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pSVar4->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&pSVar4->super_SDV,__position,(double *)&local_88);
      }
      else {
        *__position._M_current = 0.0;
        (pSVar4->super_SDV).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar5 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar5 < nrS);
  }
  this->_m_initialized = true;
  return;
}

Assistant:

void MADPComponentDiscreteStates::SetNrStates(size_t nrS)
{
    _m_nrStates = nrS;
    _m_stateVec.clear();
    if(_m_initialStateDistribution == 0)
        _m_initialStateDistribution = new StateDistributionVector();

    _m_initialStateDistribution->clear();
    for(Index i=0; i < nrS; i++)
    {
        _m_stateVec.push_back(StateDiscrete(i));
        _m_initialStateDistribution->push_back(0.0);
    }
    _m_initialized = true;
}